

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O3

void phmap::priv::
     InputIteratorBucketAllocTest<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,4ul,phmap::NullMutex>>
               (void)

{
  size_t sz;
  parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
  *s;
  char *pcVar1;
  long lVar2;
  vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_> values
  ;
  A alloc;
  parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
  m;
  AssertHelper local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  local_520;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  undefined8 uStack_4f8;
  long local_4f0;
  vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  local_4e8;
  allocator_type local_4c8;
  undefined4 local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b8;
  undefined8 uStack_4b0;
  long local_4a8;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  local_4a0;
  
  local_4c8.id_ = 0;
  local_4e8.
  super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Enum *)0x0;
  local_4e8.
  super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  ._M_impl.super__Vector_impl_data._M_start = (Enum *)0x0;
  local_4e8.
  super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Enum *)0x0;
  lVar2 = 10;
  do {
    local_4a0.sets_._M_elems[0].set_.ctrl_._0_4_ =
         hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()
                   ((Generator<phmap::priv::hash_internal::Enum,_void> *)&local_508);
    if (local_4e8.
        super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_4e8.
        super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>::
      _M_realloc_insert<phmap::priv::hash_internal::Enum>
                (&local_4e8,
                 (iterator)
                 local_4e8.
                 super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Enum *)&local_4a0);
    }
    else {
      *local_4e8.
       super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
       ._M_impl.super__Vector_impl_data._M_finish = (Enum)local_4a0.sets_._M_elems[0].set_.ctrl_;
      local_4e8.
      super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_4e8.
           super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  local_508._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
           next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl;
  local_520.
  super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  ._M_impl.super__Vector_impl_data._M_start =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (pointer)((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
                       next_id<phmap::priv::StatefulTestingEqual>()::gId + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
  ::
  parallel_hash_set<__gnu_cxx::__normal_iterator<phmap::priv::hash_internal::Enum*,std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
              *)&local_4a0,
             (__normal_iterator<phmap::priv::hash_internal::Enum_*,_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_>
              )local_4e8.
               super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<phmap::priv::hash_internal::Enum_*,_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_>
              )local_4e8.
               super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
               ._M_impl.super__Vector_impl_data._M_finish,0x7b,(hasher *)&local_508,
             (key_equal *)&local_520,&local_4c8);
  local_520.
  super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_4a0.sets_._M_elems[0].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                .
                super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                .
                super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                .super__Tuple_impl<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>.
                super__Head_base<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_false>.
                _M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
            ((internal *)&local_508,"m.get_allocator()","alloc",
             (Alloc<phmap::priv::hash_internal::Enum> *)&local_520,&local_4c8);
  if (local_508._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (Generator<phmap::priv::hash_internal::Enum,_void>)0x0) {
    testing::Message::Message((Message *)&local_520);
    if (local_500 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_500->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0xd2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_530,(Message *)&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    if (local_520.
        super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(undefined8 *)
                    local_520.
                    super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                    ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_500 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_500,local_500);
  }
  local_4c0 = 3;
  std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>::
  vector<__gnu_cxx::__normal_iterator<phmap::priv::hash_internal::Enum_const*,std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>>,void>
            ((vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>
              *)&local_4b8,
             (__normal_iterator<const_phmap::priv::hash_internal::Enum_*,_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_>
              )local_4e8.
               super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_phmap::priv::hash_internal::Enum_*,_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_>
              )local_4e8.
               super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
               ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_520);
  local_4f0 = local_4a8;
  uStack_4f8 = uStack_4b0;
  local_500 = local_4b8;
  local_4b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uStack_4b0 = 0;
  local_4a8 = 0;
  local_508._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_4c0;
  keys<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,4ul,phmap::NullMutex>>
            (&local_520,(priv *)&local_4a0,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::Enum>>
  ::operator()(&local_530,(char *)&local_508,
               (vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                *)"keys(m)");
  if (local_520.
      super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_520.
                    super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_520.
                          super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_520.
                          super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_500 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_500,local_4f0 - (long)local_500);
  }
  if (local_4b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_4b8,local_4a8 - (long)local_4b8);
  }
  if ((char)local_530.data_ == '\0') {
    testing::Message::Message((Message *)&local_508);
    if (local_528 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_528->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0xd3,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_520,(Message *)&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_520);
    if (local_508._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_508._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_528 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_528,local_528);
  }
  lVar2 = 0x18;
  local_520.
  super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    local_520.
    super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)local_520.
                         super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  *(long *)((long)&local_4a0.sets_._M_elems[0].set_.ctrl_ + lVar2));
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x498);
  local_530.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)&local_508,"m.bucket_count()","123",(unsigned_long *)&local_520,
             (int *)&local_530);
  if (local_508._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (Generator<phmap::priv::hash_internal::Enum,_void>)0x0) {
    testing::Message::Message((Message *)&local_520);
    if (local_500 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_500->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0xd4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_530,(Message *)&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    if (local_520.
        super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(undefined8 *)
                    local_520.
                    super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                    ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_500 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_500,local_500);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::~parallel_hash_set(&local_4a0);
  if (local_4e8.
      super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
      ._M_impl.super__Vector_impl_data._M_start != (Enum *)0x0) {
    operator_delete(local_4e8.
                    super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e8.
                          super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e8.
                          super__Vector_base<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void InputIteratorBucketAllocTest(std::true_type) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  std::vector<T> values;
  for (size_t i = 0; i != 10; ++i)
    values.push_back(hash_internal::Generator<T>()());
  TypeParam m(values.begin(), values.end(), 123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
  EXPECT_GE(m.bucket_count(), 123);
}